

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffc2j(char *cval,LONGLONG *ival,int *status)

{
  int iVar1;
  long lVar2;
  char dtype;
  double dval;
  int lval;
  char sval [81];
  char msg [81];
  
  if (0 < *status) {
    return *status;
  }
  if (*cval == '\0') {
    *status = 0xcc;
    return 0xcc;
  }
  ffc2xx(cval,&dtype,ival,&lval,sval,&dval,status);
  if (dtype == 'X') {
    iVar1 = 0x193;
LAB_0013f3eb:
    *status = iVar1;
    goto LAB_0013f3ed;
  }
  if (dtype == 'F') {
LAB_0013f3a1:
    iVar1 = 0x19c;
    if (9.223372036854776e+18 < ABS(dval)) goto LAB_0013f3eb;
    lVar2 = (long)dval;
LAB_0013f3db:
    *ival = lVar2;
  }
  else {
    if (dtype == 'L') {
      lVar2 = (long)lval;
      goto LAB_0013f3db;
    }
    if ((dtype == 'C') && (iVar1 = ffc2dd(sval,&dval,status), iVar1 < 1)) goto LAB_0013f3a1;
  }
  if (*status < 1) {
    return *status;
  }
LAB_0013f3ed:
  *ival = 0;
  builtin_strncpy(msg,"Error in ffc2j evaluating string as a long integer: ",0x35);
  strncat(msg,cval,0x1e);
  ffpmsg(msg);
  return *status;
}

Assistant:

int ffc2j(const char *cval,     /* I - string representation of the value */
          LONGLONG *ival,       /* O - numerical value of the input string */
          int *status)          /* IO - error status */
/*
  convert formatted string to a LONGLONG integer value, doing implicit
  datatype conversion if necessary.
*/
{
    char dtype, sval[81], msg[81];
    int lval;
    double dval;
    
    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (cval[0] == '\0')
        return(*status = VALUE_UNDEFINED);  /* null value string */
        
    /* convert the keyword to its native datatype */
    ffc2xx(cval, &dtype, ival, &lval, sval, &dval, status);

    if (dtype == 'X' )
    {
            *status = BAD_INTKEY;
    }
    else if (dtype == 'C')
    {
            /* try reading the string as a number */
            if (ffc2dd(sval, &dval, status) <= 0)
            {
              if (dval > (double) LONGLONG_MAX || dval < (double) LONGLONG_MIN)
                *status = NUM_OVERFLOW;
              else
                *ival = (LONGLONG) dval;
            }
    }
    else if (dtype == 'F')
    {
            if (dval > (double) LONGLONG_MAX || dval < (double) LONGLONG_MIN)
                *status = NUM_OVERFLOW;
            else
                *ival = (LONGLONG) dval;
    }
    else if (dtype == 'L')
    {
            *ival = (LONGLONG) lval;
    }

    if (*status > 0)
    {
            *ival = 0;
            strcpy(msg,"Error in ffc2j evaluating string as a long integer: ");
            strncat(msg,cval,30);
            ffpmsg(msg);
            return(*status);
    }


    return(*status);
}